

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void deqp::gls::ShaderExecUtil::checkTessSupport
               (RenderContext *renderCtx,ShaderSpec *shaderSpec,ShaderType stage)

{
  ShaderSpec *renderCtx_00;
  bool bVar1;
  allocator<char> local_41;
  string local_40;
  undefined4 local_20;
  ShaderType local_1c;
  int numBlockRequired;
  ShaderType stage_local;
  ShaderSpec *shaderSpec_local;
  RenderContext *renderCtx_local;
  
  local_20 = 2;
  local_1c = stage;
  _numBlockRequired = shaderSpec;
  shaderSpec_local = (ShaderSpec *)renderCtx;
  bVar1 = glu::glslVersionIsES(shaderSpec->version);
  renderCtx_00 = shaderSpec_local;
  if ((bVar1) && ((int)_numBlockRequired->version < 3)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GL_EXT_tessellation_shader",&local_41);
    checkExtension((RenderContext *)renderCtx_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  if (local_1c == SHADERTYPE_TESSELLATION_CONTROL) {
    checkLimit((RenderContext *)shaderSpec_local,0x90d8,2);
  }
  else if (local_1c == SHADERTYPE_TESSELLATION_EVALUATION) {
    checkLimit((RenderContext *)shaderSpec_local,0x90d9,2);
  }
  return;
}

Assistant:

void checkTessSupport (const glu::RenderContext& renderCtx, const ShaderSpec& shaderSpec, glu::ShaderType stage)
{
	const int numBlockRequired = 2; // highest binding is always 1 (output) i.e. count == 2

	if (glu::glslVersionIsES(shaderSpec.version) && shaderSpec.version <= glu::GLSL_VERSION_310_ES)
		checkExtension(renderCtx, "GL_EXT_tessellation_shader");

	if (stage == glu::SHADERTYPE_TESSELLATION_CONTROL)
		checkLimit(renderCtx, GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS, numBlockRequired);
	else if (stage == glu::SHADERTYPE_TESSELLATION_EVALUATION)
		checkLimit(renderCtx, GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS, numBlockRequired);
	else
		DE_ASSERT(false);
}